

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_queue.c
# Opt level: O1

int message_queue_set_max_message_processing_time_secs
              (MESSAGE_QUEUE_HANDLE message_queue,size_t seconds)

{
  LOGGER_LOG p_Var1;
  int iVar2;
  
  if (message_queue == (MESSAGE_QUEUE_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    iVar2 = 0x25a;
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/message_queue.c"
                ,"message_queue_set_max_message_processing_time_secs",0x259,1,
                "invalid argument (message_queue is NULL)");
    }
  }
  else {
    message_queue->max_message_processing_time_secs = seconds;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int message_queue_set_max_message_processing_time_secs(MESSAGE_QUEUE_HANDLE message_queue, size_t seconds)
{
    int result;

    if (message_queue == NULL)
    {
        LogError("invalid argument (message_queue is NULL)");
        result = MU_FAILURE;
    }
    else
    {
        message_queue->max_message_processing_time_secs = seconds;
        result = RESULT_OK;
    }

    return result;
}